

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::AsyncifyAssertInNonInstrumented::addAssertsInNonInstrumented
          (AsyncifyAssertInNonInstrumented *this,Function *func)

{
  Name name;
  size_t sVar1;
  char *pcVar2;
  Index index;
  Module *func_00;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  GlobalGet *value;
  LocalSet *left;
  Block *pBVar3;
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  *this_03;
  undefined1 local_130 [8];
  Walker walker;
  Type local_28;
  Index local_1c;
  Module *pMStack_18;
  Index oldState;
  Function *func_local;
  AsyncifyAssertInNonInstrumented *this_local;
  
  this_03 = &this->builder;
  pMStack_18 = (Module *)func;
  func_local = (Function *)this;
  std::
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  ::operator->(this_03);
  func_00 = pMStack_18;
  wasm::Type::Type(&local_28,i32);
  local_1c = Builder::addVar((Function *)func_00,local_28);
  this_00 = std::
            unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
            ::operator->(this_03);
  this_01 = std::
            unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
            ::operator->(this_03);
  index = local_1c;
  this_02 = std::
            unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
            ::operator->(this_03);
  pcVar2 = DAT_027e5080;
  sVar1 = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  wasm::Type::Type((Type *)&walker.oldState,i32);
  name.super_IString.str._M_str = pcVar2;
  name.super_IString.str._M_len = sVar1;
  value = Builder::makeGlobalGet(&this_02->super_Builder,name,(Type)walker._232_8_);
  left = Builder::makeLocalSet(&this_01->super_Builder,index,(Expression *)value);
  pBVar3 = Builder::makeSequence
                     (&this_00->super_Builder,(Expression *)left,
                      (Expression *)
                      (pMStack_18->elementSegments).
                      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  (pMStack_18->elementSegments).
  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar3;
  addAssertsInNonInstrumented::Walker::Walker((Walker *)local_130);
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.currModule = pMStack_18;
  walker.func = (Function *)
                std::
                unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                ::get(this_03);
  walker.builder._0_4_ = local_1c;
  Walker<Walker,_wasm::Visitor<Walker,_void>_>::walk
            ((Walker<Walker,_wasm::Visitor<Walker,_void>_> *)local_130,
             (Expression **)&pMStack_18->elementSegments);
  addAssertsInNonInstrumented::Walker::~Walker((Walker *)local_130);
  return;
}

Assistant:

void addAssertsInNonInstrumented(Function* func) {
    auto oldState = builder->addVar(func, Type::i32);
    // Add a check at the function entry.
    func->body = builder->makeSequence(
      builder->makeLocalSet(oldState,
                            builder->makeGlobalGet(ASYNCIFY_STATE, Type::i32)),
      func->body);
    // Add a check around every call.
    struct Walker : PostWalker<Walker> {
      void visitCall(Call* curr) {
        // Tail calls will need another type of check, as they wouldn't reach
        // this assertion.
        assert(!curr->isReturn);
        handleCall(curr);
      }
      void visitCallIndirect(CallIndirect* curr) {
        // Tail calls will need another type of check, as they wouldn't reach
        // this assertion.
        assert(!curr->isReturn);
        handleCall(curr);
      }
      void handleCall(Expression* call) {
        auto* check = builder->makeIf(
          builder->makeBinary(NeInt32,
                              builder->makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                              builder->makeLocalGet(oldState, Type::i32)),
          builder->makeUnreachable());
        Expression* rep;
        if (call->type.isConcrete()) {
          auto temp = builder->addVar(func, call->type);
          rep = builder->makeBlock({
            builder->makeLocalSet(temp, call),
            check,
            builder->makeLocalGet(temp, call->type),
          });
        } else {
          rep = builder->makeSequence(call, check);
        }
        replaceCurrent(rep);
      }
      Function* func;
      AsyncifyBuilder* builder;
      Index oldState;
    };
    Walker walker;
    walker.func = func;
    walker.builder = builder.get();
    walker.oldState = oldState;
    walker.walk(func->body);
  }